

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void CheckOperatorName(ExpressionContext *ctx,SynBase *source,InplaceStr name,
                      ArrayView<ArgumentData> argData)

{
  bool bVar1;
  uint uVar2;
  ArgumentData *pAVar3;
  ulong uVar4;
  char *msg;
  InplaceStr name_local;
  InplaceStr local_48;
  InplaceStr local_38;
  ArrayView<ArgumentData> argData_local;
  
  name_local.end = name.end;
  name_local.begin = name.begin;
  argData_local.data = argData.data;
  uVar2 = argData.count;
  local_38.begin = "~";
  local_38.end = "";
  argData_local.count = uVar2;
  bVar1 = InplaceStr::operator==(&name_local,&local_38);
  if (!bVar1) {
    local_48.begin = "!";
    local_48.end = "";
    bVar1 = InplaceStr::operator==(&name_local,&local_48);
    if (!bVar1) {
      local_38.begin = "+";
      local_38.end = "";
      bVar1 = InplaceStr::operator==(&name_local,&local_38);
      if (!bVar1) {
        local_48.begin = "-";
        local_48.end = "";
        bVar1 = InplaceStr::operator==(&name_local,&local_48);
        if (!bVar1) {
          local_38.begin = "&&";
          local_38.end = "";
          bVar1 = InplaceStr::operator==(&name_local,&local_38);
          if (!bVar1) {
            local_48.begin = "||";
            local_48.end = "";
            bVar1 = InplaceStr::operator==(&name_local,&local_48);
            if (!bVar1) {
              local_38.begin = "()";
              local_38.end = "";
              bVar1 = InplaceStr::operator!=(&name_local,&local_38);
              if (!bVar1) {
                return;
              }
              local_48.begin = "[]";
              local_48.end = "";
              bVar1 = InplaceStr::operator!=(&name_local,&local_48);
              if (uVar2 == 2 || !bVar1) {
                return;
              }
              uVar4 = (ulong)(uint)((int)name_local.end - (int)name_local.begin);
              msg = "ERROR: operator \'%.*s\' definition must accept exactly two arguments";
              goto LAB_001d904a;
            }
          }
          if (uVar2 == 2) {
            pAVar3 = ArrayView<ArgumentData>::operator[](&argData_local,1);
            if ((pAVar3->type != (TypeBase *)0x0) && (pAVar3->type->typeID == 0x15)) {
              pAVar3 = ArrayView<ArgumentData>::operator[](&argData_local,1);
              uVar2 = IntrusiveList<TypeHandle>::size
                                ((IntrusiveList<TypeHandle> *)&pAVar3->type[1].typeID);
              if (uVar2 == 0) {
                return;
              }
            }
          }
          uVar4 = (ulong)(uint)((int)name_local.end - (int)name_local.begin);
          msg = 
          "ERROR: operator \'%.*s\' definition must accept a function returning desired type as the second argument"
          ;
          goto LAB_001d904a;
        }
      }
      if (uVar2 - 1 < 2) {
        return;
      }
      uVar4 = (ulong)(uint)((int)name_local.end - (int)name_local.begin);
      msg = "ERROR: operator \'%.*s\' definition must accept one or two arguments";
      goto LAB_001d904a;
    }
  }
  if (uVar2 == 1) {
    return;
  }
  uVar4 = (ulong)(uint)((int)name_local.end - (int)name_local.begin);
  msg = "ERROR: operator \'%.*s\' definition must accept exactly one argument";
LAB_001d904a:
  anon_unknown.dwarf_ff84f::Stop(ctx,source,msg,uVar4);
}

Assistant:

void CheckOperatorName(ExpressionContext &ctx, SynBase *source, InplaceStr name, ArrayView<ArgumentData> argData)
{
	if(name == InplaceStr("~") || name == InplaceStr("!"))
	{
		if(argData.size() != 1)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept exactly one argument", FMT_ISTR(name));
	}
	else if(name == InplaceStr("+") || name == InplaceStr("-"))
	{
		if(argData.size() != 1 && argData.size() != 2)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept one or two arguments", FMT_ISTR(name));
	}
	else if(name == InplaceStr("&&") || name == InplaceStr("||"))
	{
		// Two arguments with the second argument being special
		if(argData.size() != 2 || !isType<TypeFunction>(argData[1].type) || getType<TypeFunction>(argData[1].type)->arguments.size() != 0)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept a function returning desired type as the second argument", FMT_ISTR(name));
	}
	else if(name != InplaceStr("()") && name != InplaceStr("[]"))
	{
		if(argData.size() != 2)
			Stop(ctx, source, "ERROR: operator '%.*s' definition must accept exactly two arguments", FMT_ISTR(name));
	}
}